

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

char get_token_from_string(char *str,int *index,char *buff)

{
  int iVar1;
  bool bVar2;
  int i;
  char c;
  char *buff_local;
  int *index_local;
  char *str_local;
  
  i = 0;
  c = str[*index];
  if (c != '\0') {
    while( true ) {
      bVar2 = false;
      if (((c != '%') && (bVar2 = false, c != '@')) && (bVar2 = false, c != '/')) {
        bVar2 = c != '\0';
      }
      if (!bVar2) break;
      buff[i] = c;
      iVar1 = *index;
      *index = iVar1 + 1;
      c = str[iVar1 + 1];
      i = i + 1;
    }
    if (((c == '%') || (c == '@')) || (c == '/')) {
      *index = *index + 1;
    }
  }
  buff[i] = '\0';
  return c;
}

Assistant:

static int get_token_from_string(const char *str, int *index, char *buff, char d)
{
   char c;
   int i;

   buff[0] = '\0';

   c = str[(*index)];
   if (c == '\0')
      return 0;
   if (c == d) {
      (*index)++;
      return 0;
   }

   while (c == '\n' || c == '\r' || c == '\t') {
      if (c == '\0')
         return 0;
      c = str[++(*index)];
   }

   for (i = 0; c != d && c != '\n' && c != '\r' && c != '\t' && c != '\0'; i++) {
      buff[i] = c;
      c = str[++(*index)];
   }
   if (c == d)
      (*index)++;

   buff[i] = '\0';
   return i;
}